

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O1

Session * __thiscall
FIX::SessionFactory::create(SessionFactory *this,SessionID *sessionID,Dictionary *settings)

{
  string *psVar1;
  _func_int **pp_Var2;
  _Base_ptr *pp_Var3;
  int64_t *piVar4;
  Application *application;
  MessageStoreFactory *messageStoreFactory;
  int64_t iVar5;
  undefined8 uVar6;
  int64_t iVar7;
  int iVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  uint startDay;
  uint endDay;
  int endDay_00;
  undefined7 extraout_var;
  Session *this_00;
  ConfigError *pCVar15;
  TimeRange *pTVar16;
  Dictionary *pDVar17;
  undefined1 local_800 [48];
  Dictionary *local_7d0;
  undefined4 local_7c4;
  HeartBtInt heartBtInt;
  TimeRange utcLogonTime;
  field_metrics local_708;
  TimeRange localLogonTime;
  UtcTimeOnly logoutTime;
  UtcTimeOnly logonTime;
  string defaultApplVerID;
  string connectionType;
  _Any_data local_618;
  code *local_608;
  code *local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5f0;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  string local_5b8;
  string local_598;
  string local_578;
  TimeRange utcSessionTime;
  TimeRange sessionTimeRange;
  int local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  DataDictionaryProvider dataDictionaryProvider;
  TimeRange localSessionTime;
  
  pp_Var3 = &dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent;
  dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dataDictionaryProvider,"ConnectionType","");
  Dictionary::getString(&connectionType,settings,(string *)&dataDictionaryProvider,false);
  if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                    (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
  }
  iVar14 = std::__cxx11::string::compare((char *)&connectionType);
  if ((iVar14 != 0) &&
     (iVar14 = std::__cxx11::string::compare((char *)&connectionType), iVar14 != 0)) {
    pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
    dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dataDictionaryProvider,"Invalid ConnectionType","");
    ConfigError::ConfigError(pCVar15,(string *)&dataDictionaryProvider);
    __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  iVar14 = std::__cxx11::string::compare((char *)&connectionType);
  if (iVar14 == 0) {
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"SessionQualifier","");
    bVar12 = Dictionary::has(settings,&local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar12 = false;
  }
  if (bVar12 != false) {
    pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
    dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dataDictionaryProvider,"SessionQualifier cannot be used with acceptor.",""
              );
    ConfigError::ConfigError(pCVar15,(string *)&dataDictionaryProvider);
    __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dataDictionaryProvider,"UseDataDictionary","");
  local_7d0 = settings;
  bVar12 = Dictionary::has(settings,(string *)&dataDictionaryProvider);
  if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                    (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                    super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
  }
  pDVar17 = local_7d0;
  bVar13 = true;
  if (bVar12) {
    dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dataDictionaryProvider,"UseDataDictionary","");
    bVar13 = Dictionary::getBool(pDVar17,(string *)&dataDictionaryProvider);
    if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
      operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                      (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                      super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
    }
  }
  defaultApplVerID._M_dataplus._M_p = (pointer)&defaultApplVerID.field_2;
  defaultApplVerID._M_string_length = 0;
  defaultApplVerID.field_2._M_local_buf[0] = '\0';
  if (sessionID->m_isFIXT == true) {
    dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dataDictionaryProvider,"DefaultApplVerID","");
    bVar12 = Dictionary::has(pDVar17,(string *)&dataDictionaryProvider);
    if ((_Base_ptr *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ != pp_Var3) {
      operator_delete((void *)dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_,
                      (ulong)((long)&(dataDictionaryProvider.m_transportDictionaries._M_t._M_impl.
                                      super__Rb_tree_header._M_header._M_parent)->_M_color + 1));
    }
    if (!bVar12) {
      pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
      dataDictionaryProvider.m_transportDictionaries._M_t._M_impl._0_8_ = pp_Var3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dataDictionaryProvider,"ApplVerID is required for FIXT transport","");
      ConfigError::ConfigError(pCVar15,(string *)&dataDictionaryProvider);
      __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    piVar4 = &utcSessionTime.m_startTime.super_DateTime.m_time;
    utcSessionTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)piVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&utcSessionTime,"DefaultApplVerID","")
    ;
    pDVar17 = local_7d0;
    Dictionary::getString((string *)&utcLogonTime,local_7d0,(string *)&utcSessionTime,false);
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_001f8470;
    heartBtInt.super_IntField.super_FieldBase.m_tag = 8;
    heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p =
         (pointer)&heartBtInt.super_IntField.super_FieldBase.m_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&heartBtInt.super_IntField.super_FieldBase.m_string,
               utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
               CONCAT44(utcLogonTime.m_startTime.super_DateTime._12_4_,
                        utcLogonTime.m_startTime.super_DateTime.m_date) +
               (long)utcLogonTime.m_startTime.super_DateTime._vptr_DateTime);
    heartBtInt.super_IntField.super_FieldBase.m_data._M_dataplus._M_p =
         (pointer)&heartBtInt.super_IntField.super_FieldBase.m_data.field_2;
    heartBtInt.super_IntField.super_FieldBase.m_data._M_string_length = 0;
    heartBtInt.super_IntField.super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
    heartBtInt.super_IntField.super_FieldBase.m_metrics.m_length = 0;
    heartBtInt.super_IntField.super_FieldBase.m_metrics.m_checksum = 0;
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_001f8410;
    Message::toApplVerID((ApplVerID *)&dataDictionaryProvider,(BeginString *)&heartBtInt);
    std::__cxx11::string::_M_assign((string *)&defaultApplVerID);
    FieldBase::~FieldBase((FieldBase *)&dataDictionaryProvider);
    FieldBase::~FieldBase((FieldBase *)&heartBtInt);
    if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
        (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
      operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    if (utcSessionTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
      operator_delete(utcSessionTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcSessionTime.m_startTime.super_DateTime.m_time + 1);
    }
  }
  DataDictionaryProvider::DataDictionaryProvider(&dataDictionaryProvider);
  if (bVar13 != false) {
    if (sessionID->m_isFIXT == true) {
      processFixtDataDictionaries(this,sessionID,pDVar17,&dataDictionaryProvider);
    }
    else {
      processFixDataDictionary(this,sessionID,pDVar17,&dataDictionaryProvider);
    }
  }
  psVar1 = &heartBtInt.super_IntField.super_FieldBase.m_string;
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"UseLocalTime","");
  bVar12 = Dictionary::has(pDVar17,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (bVar12) {
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"UseLocalTime","");
    bVar12 = Dictionary::getBool(pDVar17,(string *)&heartBtInt);
    if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
      operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                      (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p +
                             1));
    }
  }
  else {
    bVar12 = false;
  }
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"NonStopSession","");
  bVar13 = Dictionary::has(pDVar17,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (bVar13) {
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"NonStopSession","");
    bVar13 = Dictionary::getBool(pDVar17,(string *)&heartBtInt);
    local_7c4 = (undefined4)CONCAT71(extraout_var,bVar13);
    if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
      operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                      (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p +
                             1));
    }
  }
  else {
    local_7c4 = 0;
  }
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,"StartDay","");
  startDay = Dictionary::getDay(pDVar17,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&heartBtInt,&END_DAY,0x1d152c);
  endDay = Dictionary::getDay(local_7d0,(string *)&heartBtInt);
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  startTime.super_DateTime._8_8_ = (ulong)(uint)startTime.super_DateTime._12_4_ << 0x20;
  startTime.super_DateTime.m_time = 0;
  startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8908;
  endTime.super_DateTime._8_8_ = (ulong)(uint)endTime.super_DateTime._12_4_ << 0x20;
  endTime.super_DateTime.m_time = 0;
  endTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8908;
  piVar4 = &utcLogonTime.m_startTime.super_DateTime.m_time;
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"StartTime","");
  Dictionary::getString((string *)&heartBtInt,local_7d0,(string *)&utcLogonTime,false);
  UtcTimeOnlyConvertor::convert(&utcSessionTime.m_startTime,(string *)&heartBtInt);
  startTime.super_DateTime.m_date = utcSessionTime.m_startTime.super_DateTime.m_date;
  startTime.super_DateTime._12_4_ = utcSessionTime.m_startTime.super_DateTime._12_4_;
  startTime.super_DateTime.m_time = utcSessionTime.m_startTime.super_DateTime.m_time;
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)piVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"EndTime","");
  Dictionary::getString((string *)&heartBtInt,local_7d0,(string *)&utcLogonTime,false);
  UtcTimeOnlyConvertor::convert(&utcSessionTime.m_startTime,(string *)&heartBtInt);
  endTime.super_DateTime.m_date = utcSessionTime.m_startTime.super_DateTime.m_date;
  endTime.super_DateTime._12_4_ = utcSessionTime.m_startTime.super_DateTime._12_4_;
  endTime.super_DateTime.m_time = utcSessionTime.m_startTime.super_DateTime.m_time;
  if ((string *)heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase != psVar1) {
    operator_delete(heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase,
                    (ulong)(heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p + 1)
                   );
  }
  if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
    operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                    utcLogonTime.m_startTime.super_DateTime.m_time + 1);
  }
  TimeRange::TimeRange(&utcSessionTime,&startTime,&endTime,startDay,endDay);
  heartBtInt.super_IntField.super_FieldBase.m_tag = 0;
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__DateTime_001fa1e8;
  heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p =
       (pointer)((((startTime.super_DateTime.m_time / 60000000000) % 0x3c) * 0x3c +
                 (startTime.super_DateTime.m_time / 3600000000000) * 0xe10 +
                 (startTime.super_DateTime.m_time / 1000000000) % 0x3c) * 1000000000);
  utcLogonTime.m_startTime.super_DateTime.m_date = 0;
  local_5f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&PTR__DateTime_001fa1e8;
  utcLogonTime.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001fa1e8;
  utcLogonTime.m_startTime.super_DateTime.m_time =
       (((endTime.super_DateTime.m_time / 60000000000) % 0x3c) * 0x3c +
       (endTime.super_DateTime.m_time / 3600000000000) * 0xe10 +
       (endTime.super_DateTime.m_time / 1000000000) % 0x3c) * 1000000000;
  TimeRange::TimeRange
            (&localSessionTime,(LocalTimeOnly *)&heartBtInt,(LocalTimeOnly *)&utcLogonTime,startDay,
             endDay);
  pDVar17 = local_7d0;
  sessionTimeRange.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8600
  ;
  pTVar16 = &utcSessionTime;
  if (bVar12 != false) {
    pTVar16 = &localSessionTime;
  }
  sessionTimeRange.m_startTime.super_DateTime.m_date = (pTVar16->m_startTime).super_DateTime.m_date;
  sessionTimeRange.m_startTime.super_DateTime._12_4_ =
       *(undefined4 *)&(pTVar16->m_startTime).super_DateTime.field_0xc;
  sessionTimeRange.m_startTime.super_DateTime.m_time = (pTVar16->m_startTime).super_DateTime.m_time;
  sessionTimeRange.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8908
  ;
  sessionTimeRange.m_endTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8600;
  sessionTimeRange.m_endTime.super_DateTime.m_date = (pTVar16->m_endTime).super_DateTime.m_date;
  sessionTimeRange.m_endTime.super_DateTime._12_4_ =
       *(undefined4 *)&(pTVar16->m_endTime).super_DateTime.field_0xc;
  sessionTimeRange.m_endTime.super_DateTime.m_time._0_4_ =
       (int)(pTVar16->m_endTime).super_DateTime.m_time;
  sessionTimeRange.m_endTime.super_DateTime.m_time._4_4_ =
       *(undefined4 *)((long)&(pTVar16->m_endTime).super_DateTime.m_time + 4);
  sessionTimeRange.m_endTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8908;
  sessionTimeRange.m_startDay = pTVar16->m_startDay;
  sessionTimeRange.m_endDay = pTVar16->m_endDay;
  sessionTimeRange.m_useLocalTime = pTVar16->m_useLocalTime;
  if (-1 < (int)endDay || (int)startDay < 0) {
    if ((int)startDay < 0 && -1 < (int)endDay) {
      pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
      heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
           (_func_int **)&heartBtInt.super_IntField.super_FieldBase.m_string;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&heartBtInt,"EndDay used without StartDay","");
      ConfigError::ConfigError(pCVar15,(string *)&heartBtInt);
      __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    if (((char)local_7c4 != '\0') &&
       ((((-1 < (int)(endDay & startDay) || (startTime.super_DateTime.m_date != 0)) ||
         (startTime.super_DateTime.m_time != 0)) ||
        ((endTime.super_DateTime.m_date != 0 || (endTime.super_DateTime.m_time != 0)))))) {
      pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
      heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
           (_func_int **)&heartBtInt.super_IntField.super_FieldBase.m_string;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&heartBtInt,"NonStopSession used with StartTime/EndTime/StartDay/EndDay",
                 "");
      ConfigError::ConfigError(pCVar15,(string *)&heartBtInt);
      __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    IntField::IntField(&heartBtInt.super_IntField,0x6c,0);
    heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_001f9ca8;
    iVar14 = std::__cxx11::string::compare((char *)&connectionType);
    if (iVar14 == 0) {
      localLogonTime.m_startTime.super_DateTime._vptr_DateTime =
           (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time;
      std::__cxx11::string::_M_construct<char_const*>((string *)&localLogonTime,"HeartBtInt","");
      iVar14 = Dictionary::getInt(pDVar17,(string *)&localLogonTime);
      IntField::IntField((IntField *)&utcLogonTime,0x6c,iVar14);
      utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
           (_func_int **)&PTR__FieldBase_001f9ca8;
      heartBtInt.super_IntField.super_FieldBase.m_tag =
           utcLogonTime.m_startTime.super_DateTime.m_date;
      std::__cxx11::string::_M_assign((string *)&heartBtInt.super_IntField.super_FieldBase.m_string)
      ;
      heartBtInt.super_IntField.super_FieldBase.m_metrics = local_708;
      heartBtInt.super_IntField.super_FieldBase.m_data._M_string_length = 0;
      *heartBtInt.super_IntField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
      FieldBase::~FieldBase((FieldBase *)&utcLogonTime);
      if (localLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
          (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time) {
        operator_delete(localLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                        localLogonTime.m_startTime.super_DateTime.m_time + 1);
      }
      iVar14 = IntField::getValue(&heartBtInt.super_IntField);
      if (iVar14 < 1) {
        pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
        utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
             (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&utcLogonTime,"Heartbeat must be greater than zero","");
        ConfigError::ConfigError(pCVar15,(string *)&utcLogonTime);
        __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
      }
    }
    this_00 = (Session *)operator_new(0x878);
    local_618._M_unused._M_object = (void *)0x0;
    local_618._8_8_ = 0;
    local_600 = std::
                _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/SessionFactory.cpp:133:7)>
                ::_M_invoke;
    local_608 = std::
                _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/SessionFactory.cpp:133:7)>
                ::_M_manager;
    application = this->m_application;
    messageStoreFactory = this->m_messageStoreFactory;
    iVar14 = IntField::getValue(&heartBtInt.super_IntField);
    Session::Session(this_00,(function<FIX::UtcTimeStamp_()> *)&local_618,application,
                     messageStoreFactory,sessionID,&dataDictionaryProvider,&sessionTimeRange,iVar14,
                     this->m_pLogFactory);
    if (local_608 != (code *)0x0) {
      (*local_608)(&local_618,&local_618,__destroy_functor);
    }
    std::__cxx11::string::_M_assign((string *)&this_00->m_senderDefaultApplVerID);
    pDVar17 = local_7d0;
    utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
         (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
    std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"LogonDay","");
    iVar14 = Dictionary::getDay(pDVar17,(string *)&utcLogonTime);
    if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
        (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
      operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    utcLogonTime.m_startTime.super_DateTime._vptr_DateTime =
         (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time;
    std::__cxx11::string::_M_construct<char_const*>((string *)&utcLogonTime,"LogoutDay","");
    endDay_00 = Dictionary::getDay(pDVar17,(string *)&utcLogonTime);
    if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
        (_func_int **)&utcLogonTime.m_startTime.super_DateTime.m_time) {
      operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    logonTime.super_DateTime.m_date = startTime.super_DateTime.m_date;
    logonTime.super_DateTime._12_4_ = startTime.super_DateTime._12_4_;
    logonTime.super_DateTime.m_time = startTime.super_DateTime.m_time;
    logonTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8908;
    logoutTime.super_DateTime.m_date = endTime.super_DateTime.m_date;
    logoutTime.super_DateTime._12_4_ = endTime.super_DateTime._12_4_;
    logoutTime.super_DateTime.m_time = endTime.super_DateTime.m_time;
    logoutTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001f8908;
    localLogonTime.m_startTime.super_DateTime._vptr_DateTime =
         (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time;
    std::__cxx11::string::_M_construct<char_const*>((string *)&localLogonTime,"LogonTime","");
    piVar4 = &utcLogonTime.m_startTime.super_DateTime.m_time;
    Dictionary::getString((string *)&utcLogonTime,pDVar17,(string *)&localLogonTime,false);
    UtcTimeOnlyConvertor::convert((UtcTimeOnly *)local_800,(string *)&utcLogonTime);
    logonTime.super_DateTime.m_time = local_800._16_8_;
    if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
      operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    if (localLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
        (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time) {
      operator_delete(localLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      localLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    localLogonTime.m_startTime.super_DateTime._vptr_DateTime =
         (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time;
    std::__cxx11::string::_M_construct<char_const*>((string *)&localLogonTime,"LogoutTime","");
    Dictionary::getString((string *)&utcLogonTime,pDVar17,(string *)&localLogonTime,false);
    UtcTimeOnlyConvertor::convert((UtcTimeOnly *)local_800,(string *)&utcLogonTime);
    logoutTime.super_DateTime.m_time = local_800._16_8_;
    if (utcLogonTime.m_startTime.super_DateTime._vptr_DateTime != (_func_int **)piVar4) {
      operator_delete(utcLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      utcLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    if (localLogonTime.m_startTime.super_DateTime._vptr_DateTime !=
        (_func_int **)&localLogonTime.m_startTime.super_DateTime.m_time) {
      operator_delete(localLogonTime.m_startTime.super_DateTime._vptr_DateTime,
                      localLogonTime.m_startTime.super_DateTime.m_time + 1);
    }
    TimeRange::TimeRange(&utcLogonTime,&logonTime,&logoutTime,iVar14,endDay_00);
    local_800._8_4_ = _S_red;
    local_800._0_8_ = local_5f0;
    local_800._16_8_ =
         (((logonTime.super_DateTime.m_time / 60000000000) % 0x3c) * 0x3c +
         (logonTime.super_DateTime.m_time / 3600000000000) * 0xe10 +
         (logonTime.super_DateTime.m_time / 1000000000) % 0x3c) * 1000000000;
    local_598._M_string_length._0_4_ = 0;
    local_598._M_dataplus._M_p = (pointer)local_5f0;
    local_598.field_2._M_allocated_capacity =
         (((logoutTime.super_DateTime.m_time / 60000000000) % 0x3c) * 0x3c +
         (logoutTime.super_DateTime.m_time / 3600000000000) * 0xe10 +
         (logoutTime.super_DateTime.m_time / 1000000000) % 0x3c) * 1000000000;
    TimeRange::TimeRange
              (&localLogonTime,(LocalTimeOnly *)local_800,(LocalTimeOnly *)&local_598,iVar14,
               endDay_00);
    pTVar16 = &utcLogonTime;
    if (bVar12 != false) {
      pTVar16 = &localLogonTime;
    }
    iVar8 = (pTVar16->m_startTime).super_DateTime.m_date;
    uVar9 = *(undefined4 *)&(pTVar16->m_startTime).super_DateTime.field_0xc;
    iVar5 = (pTVar16->m_startTime).super_DateTime.m_time;
    uVar6 = *(undefined8 *)&(pTVar16->m_endTime).super_DateTime.m_date;
    iVar7 = (pTVar16->m_endTime).super_DateTime.m_time;
    iVar10 = pTVar16->m_startDay;
    iVar11 = pTVar16->m_endDay;
    bVar12 = pTVar16->m_useLocalTime;
    bVar13 = TimeRange::isInRange(&sessionTimeRange,&logonTime.super_DateTime,iVar14);
    pDVar17 = local_7d0;
    if (!bVar13) {
      pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_800._0_8_ = local_800 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_800,"LogonTime must be between StartTime and EndTime","");
      ConfigError::ConfigError(pCVar15,(string *)local_800);
      __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    bVar13 = TimeRange::isInRange(&sessionTimeRange,&logoutTime.super_DateTime,endDay_00);
    if (!bVar13) {
      pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_800._0_8_ = local_800 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_800,"LogoutTime must be between StartTime and EndTime","");
      ConfigError::ConfigError(pCVar15,(string *)local_800);
      __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    (this_00->m_logonTime).m_startTime.super_DateTime.m_date = iVar8;
    *(undefined4 *)&(this_00->m_logonTime).m_startTime.super_DateTime.field_0xc = uVar9;
    (this_00->m_logonTime).m_startTime.super_DateTime.m_time = iVar5;
    local_4d8 = (int)uVar6;
    uStack_4d4 = (undefined4)((ulong)uVar6 >> 0x20);
    uStack_4d0 = (undefined4)iVar7;
    uStack_4cc = (undefined4)((ulong)iVar7 >> 0x20);
    (this_00->m_logonTime).m_endTime.super_DateTime.m_date = local_4d8;
    *(undefined4 *)&(this_00->m_logonTime).m_endTime.super_DateTime.field_0xc = uStack_4d4;
    *(undefined4 *)&(this_00->m_logonTime).m_endTime.super_DateTime.m_time = uStack_4d0;
    *(undefined4 *)((long)&(this_00->m_logonTime).m_endTime.super_DateTime.m_time + 4) = uStack_4cc;
    (this_00->m_logonTime).m_startDay = iVar10;
    (this_00->m_logonTime).m_endDay = iVar11;
    (this_00->m_logonTime).m_useLocalTime = bVar12;
    pp_Var2 = (_func_int **)(local_800 + 0x10);
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_800,"SendRedundantResendRequests","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_800,"SendRedundantResendRequests","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_sendRedundantResendRequests = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"CheckCompID","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"CheckCompID","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_checkCompId = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"CheckLatency","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"CheckLatency","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_checkLatency = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"MaxLatency","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"MaxLatency","");
      iVar14 = Dictionary::getInt(pDVar17,(string *)local_800);
      this_00->m_maxLatency = iVar14;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"LogonTimeout","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"LogonTimeout","");
      iVar14 = Dictionary::getInt(pDVar17,(string *)local_800);
      (this_00->m_state).m_logonTimeout = iVar14;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"LogoutTimeout","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"LogoutTimeout","");
      iVar14 = Dictionary::getInt(pDVar17,(string *)local_800);
      (this_00->m_state).m_logoutTimeout = iVar14;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"ResetOnLogon","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"ResetOnLogon","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_resetOnLogon = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"ResetOnLogout","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"ResetOnLogout","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_resetOnLogout = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"ResetOnDisconnect","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"ResetOnDisconnect","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_resetOnDisconnect = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"RefreshOnLogon","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"RefreshOnLogon","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_refreshOnLogon = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_800,"MillisecondsInTimeStamp","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_800,"MillisecondsInTimeStamp","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_timestampPrecision = (uint)bVar12 + (uint)bVar12 * 2;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"PersistMessages","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"PersistMessages","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_persistMessages = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_800,"ValidateLengthAndChecksum","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_800,"ValidateLengthAndChecksum","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_validateLengthAndChecksum = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_800,"SendNextExpectedMsgSeqNum","");
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    pDVar17 = local_7d0;
    if (bVar12) {
      local_800._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_800,"SendNextExpectedMsgSeqNum","");
      bVar12 = Dictionary::getBool(pDVar17,(string *)local_800);
      this_00->m_sendNextExpectedMsgSeqNum = bVar12;
      if ((_func_int **)local_800._0_8_ != pp_Var2) {
        operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
      }
    }
    if ((char)local_7c4 != '\0') {
      this_00->m_isNonStopSession = true;
    }
    local_800._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"AllowedRemoteAddresses","")
    ;
    bVar12 = Dictionary::has(pDVar17,(string *)local_800);
    if ((_func_int **)local_800._0_8_ != pp_Var2) {
      operator_delete((void *)local_800._0_8_,local_800._16_8_ + 1);
    }
    if (bVar12) {
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5b8,"AllowedRemoteAddresses","");
      Dictionary::getString(&local_598,local_7d0,&local_5b8,false);
      string_split((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_800,&local_598,',');
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this_00->m_allowedRemoteAddresses)._M_t,
                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_800);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_800);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
    }
    FieldBase::~FieldBase((FieldBase *)&heartBtInt);
    DataDictionary::~DataDictionary(&dataDictionaryProvider.emptyDataDictionary);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
    ::~_Rb_tree(&dataDictionaryProvider.m_applicationDictionaries._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
                 *)&dataDictionaryProvider);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)defaultApplVerID._M_dataplus._M_p != &defaultApplVerID.field_2) {
      operator_delete(defaultApplVerID._M_dataplus._M_p,
                      CONCAT71(defaultApplVerID.field_2._M_allocated_capacity._1_7_,
                               defaultApplVerID.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)connectionType._M_dataplus._M_p != &connectionType.field_2) {
      operator_delete(connectionType._M_dataplus._M_p,
                      connectionType.field_2._M_allocated_capacity + 1);
    }
    return this_00;
  }
  pCVar15 = (ConfigError *)__cxa_allocate_exception(0x50);
  heartBtInt.super_IntField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&heartBtInt.super_IntField.super_FieldBase.m_string;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&heartBtInt,"StartDay used without EndDay","");
  ConfigError::ConfigError(pCVar15,(string *)&heartBtInt);
  __cxa_throw(pCVar15,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  std::string connectionType = settings.getString(CONNECTION_TYPE);
  if (connectionType != "acceptor" && connectionType != "initiator") {
    throw ConfigError("Invalid ConnectionType");
  }

  if (connectionType == "acceptor" && settings.has(SESSION_QUALIFIER)) {
    throw ConfigError("SessionQualifier cannot be used with acceptor.");
  }

  bool useDataDictionary = true;
  if (settings.has(USE_DATA_DICTIONARY)) {
    useDataDictionary = settings.getBool(USE_DATA_DICTIONARY);
  }

  std::string defaultApplVerID;
  if (sessionID.isFIXT()) {
    if (!settings.has(DEFAULT_APPLVERID)) {
      throw ConfigError("ApplVerID is required for FIXT transport");
    }
    defaultApplVerID = Message::toApplVerID(settings.getString(DEFAULT_APPLVERID));
  }

  DataDictionaryProvider dataDictionaryProvider;
  if (useDataDictionary) {
    if (sessionID.isFIXT()) {
      processFixtDataDictionaries(sessionID, settings, dataDictionaryProvider);
    } else {
      processFixDataDictionary(sessionID, settings, dataDictionaryProvider);
    }
  }

  bool useLocalTime = false;
  if (settings.has(USE_LOCAL_TIME)) {
    useLocalTime = settings.getBool(USE_LOCAL_TIME);
  }

  bool isNonStopSession = false;
  if (settings.has(NON_STOP_SESSION)) {
    isNonStopSession = settings.getBool(NON_STOP_SESSION);
  }

  int startDay = -1;
  int endDay = -1;
  try {
    startDay = settings.getDay(START_DAY);
    endDay = settings.getDay(END_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly startTime = UtcTimeOnly(0, 0, 0);
  UtcTimeOnly endTime = UtcTimeOnly(0, 0, 0);
  try {
    startTime = UtcTimeOnlyConvertor::convert(settings.getString(START_TIME));
    endTime = UtcTimeOnlyConvertor::convert(settings.getString(END_TIME));
  } catch (ConfigError &e) {
    if (!isNonStopSession) {
      throw e;
    }
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcSessionTime(startTime, endTime, startDay, endDay);
  TimeRange localSessionTime(
      LocalTimeOnly(startTime.getHour(), startTime.getMinute(), startTime.getSecond()),
      LocalTimeOnly(endTime.getHour(), endTime.getMinute(), endTime.getSecond()),
      startDay,
      endDay);
  TimeRange sessionTimeRange = useLocalTime ? localSessionTime : utcSessionTime;

  if (startDay >= 0 && endDay < 0) {
    throw ConfigError("StartDay used without EndDay");
  }
  if (endDay >= 0 && startDay < 0) {
    throw ConfigError("EndDay used without StartDay");
  }

  if (isNonStopSession
      && (startDay >= 0 || endDay >= 0 || startTime != UtcTimeOnly(0, 0, 0) || endTime != UtcTimeOnly(0, 0, 0))) {
    throw ConfigError("NonStopSession used with StartTime/EndTime/StartDay/EndDay");
  }

  HeartBtInt heartBtInt(0);
  if (connectionType == "initiator") {
    heartBtInt = HeartBtInt(settings.getInt(HEARTBTINT));
    if (heartBtInt <= 0) {
      throw ConfigError("Heartbeat must be greater than zero");
    }
  }

  std::unique_ptr<Session> pSession;
  pSession.reset(new Session(
      []() { return UtcTimeStamp::now(); },
      m_application,
      m_messageStoreFactory,
      sessionID,
      dataDictionaryProvider,
      sessionTimeRange,
      heartBtInt,
      m_pLogFactory));

  pSession->setSenderDefaultApplVerID(defaultApplVerID);

  int logonDay = startDay;
  int logoutDay = endDay;
  try {
    logonDay = settings.getDay(LOGON_DAY);
    logoutDay = settings.getDay(LOGOUT_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly logonTime(startTime);
  UtcTimeOnly logoutTime(endTime);
  try {
    logonTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGON_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  try {
    logoutTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGOUT_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcLogonTime(logonTime, logoutTime, logonDay, logoutDay);
  TimeRange localLogonTime(
      LocalTimeOnly(logonTime.getHour(), logonTime.getMinute(), logonTime.getSecond()),
      LocalTimeOnly(logoutTime.getHour(), logoutTime.getMinute(), logoutTime.getSecond()),
      logonDay,
      logoutDay);
  TimeRange logonTimeRange = useLocalTime ? localLogonTime : utcLogonTime;

  if (!sessionTimeRange.isInRange(logonTime, logonDay)) {
    throw ConfigError("LogonTime must be between StartTime and EndTime");
  }
  if (!sessionTimeRange.isInRange(logoutTime, logoutDay)) {
    throw ConfigError("LogoutTime must be between StartTime and EndTime");
  }
  pSession->setLogonTime(logonTimeRange);

  if (settings.has(SEND_REDUNDANT_RESENDREQUESTS)) {
    pSession->setSendRedundantResendRequests(settings.getBool(SEND_REDUNDANT_RESENDREQUESTS));
  }
  if (settings.has(CHECK_COMPID)) {
    pSession->setCheckCompId(settings.getBool(CHECK_COMPID));
  }
  if (settings.has(CHECK_LATENCY)) {
    pSession->setCheckLatency(settings.getBool(CHECK_LATENCY));
  }
  if (settings.has(MAX_LATENCY)) {
    pSession->setMaxLatency(settings.getInt(MAX_LATENCY));
  }
  if (settings.has(LOGON_TIMEOUT)) {
    pSession->setLogonTimeout(settings.getInt(LOGON_TIMEOUT));
  }
  if (settings.has(LOGOUT_TIMEOUT)) {
    pSession->setLogoutTimeout(settings.getInt(LOGOUT_TIMEOUT));
  }
  if (settings.has(RESET_ON_LOGON)) {
    pSession->setResetOnLogon(settings.getBool(RESET_ON_LOGON));
  }
  if (settings.has(RESET_ON_LOGOUT)) {
    pSession->setResetOnLogout(settings.getBool(RESET_ON_LOGOUT));
  }
  if (settings.has(RESET_ON_DISCONNECT)) {
    pSession->setResetOnDisconnect(settings.getBool(RESET_ON_DISCONNECT));
  }
  if (settings.has(REFRESH_ON_LOGON)) {
    pSession->setRefreshOnLogon(settings.getBool(REFRESH_ON_LOGON));
  }
  if (settings.has(MILLISECONDS_IN_TIMESTAMP)) {
    pSession->setMillisecondsInTimeStamp(settings.getBool(MILLISECONDS_IN_TIMESTAMP));
  }
  if (settings.has(PERSIST_MESSAGES)) {
    pSession->setPersistMessages(settings.getBool(PERSIST_MESSAGES));
  }
  if (settings.has(VALIDATE_LENGTH_AND_CHECKSUM)) {
    pSession->setValidateLengthAndChecksum(settings.getBool(VALIDATE_LENGTH_AND_CHECKSUM));
  }
  if (settings.has(SEND_NEXT_EXPECTED_MSG_SEQ_NUM)) {
    pSession->setSendNextExpectedMsgSeqNum(settings.getBool(SEND_NEXT_EXPECTED_MSG_SEQ_NUM));
  }
  if (isNonStopSession) {
    pSession->setIsNonStopSession(isNonStopSession);
  }
  if (settings.has(ALLOWED_REMOTE_ADDRESSES)) {
    pSession->setAllowedRemoteAddresses(string_split(settings.getString(ALLOWED_REMOTE_ADDRESSES), ','));
  }

  return pSession.release();
}